

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndWhileCommand.cxx
# Opt level: O2

bool __thiscall
cmEndWhileCommand::InvokeInitialPass
          (cmEndWhileCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  allocator local_29;
  string local_28;
  
  if ((args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string
              ((string *)&local_28,
               "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure.",
               &local_29);
    cmCommand::SetError(&this->super_cmCommand,&local_28);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_28,
               "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure. Or its arguments did not match the opening WHILE command."
               ,&local_29);
    cmCommand::SetError(&this->super_cmCommand,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return false;
}

Assistant:

bool cmEndWhileCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const& args,
                    cmExecutionStatus &)
{
  if (args.empty())
    {
    this->SetError("An ENDWHILE command was found outside of a proper "
                   "WHILE ENDWHILE structure.");
    }
  else
    {
    this->SetError("An ENDWHILE command was found outside of a proper "
                   "WHILE ENDWHILE structure. Or its arguments did not "
                   "match the opening WHILE command.");
    }

  return false;
}